

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pyraminx.cpp
# Opt level: O2

void __thiscall Pyraminx::turn_layer(Pyraminx *this,Corner corner,int layer,Direction dir)

{
  element_type *this_00;
  __shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2> local_118;
  Face *local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  Face *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  undefined1 local_e8 [64];
  _Vector_base<Color,_std::allocator<Color>_> local_a8;
  _Vector_base<Color,_std::allocator<Color>_> local_90;
  _Vector_base<Color,_std::allocator<Color>_> local_78;
  _Vector_base<Color,_std::allocator<Color>_> local_60;
  _Vector_base<Color,_std::allocator<Color>_> local_48;
  
  while (layer == 2) {
    dir = (Direction)(dir == clockwise);
    turn_layer(this,corner,0,dir);
    turn_layer(this,corner,1,dir);
    layer = 3;
  }
  local_118._M_ptr = (Face *)0x0;
  local_118._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = &(this->blue_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>;
  if (corner == B) {
    p_Var1 = &(this->green_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>::operator=(&local_118,p_Var1);
  Face::get_sending_neighbor((Face *)&local_108,(Corner)local_118._M_ptr,corner);
  Face::get_receiving_neighbor((Face *)&local_f8,(Corner)local_118._M_ptr,corner);
  Face::get_layer((vector<Color,_std::allocator<Color>_> *)&local_60,local_108,corner,layer);
  this_00 = local_118._M_ptr;
  std::vector<Color,_std::allocator<Color>_>::vector
            ((vector<Color,_std::allocator<Color>_> *)&local_90,
             (vector<Color,_std::allocator<Color>_> *)&local_60);
  Face::update_layer((vector<Color,_std::allocator<Color>_> *)&local_78,this_00,corner,layer,
                     (vector<Color,_std::allocator<Color>_> *)&local_90);
  std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base(&local_90);
  std::vector<Color,_std::allocator<Color>_>::vector
            ((vector<Color,_std::allocator<Color>_> *)(local_e8 + 0x28),
             (vector<Color,_std::allocator<Color>_> *)&local_78);
  Face::update_layer((vector<Color,_std::allocator<Color>_> *)&local_a8,local_f8,corner,layer,
                     (vector<Color,_std::allocator<Color>_> *)(local_e8 + 0x28));
  std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
            ((_Vector_base<Color,_std::allocator<Color>_> *)(local_e8 + 0x28));
  std::vector<Color,_std::allocator<Color>_>::vector
            ((vector<Color,_std::allocator<Color>_> *)(local_e8 + 0x10),
             (vector<Color,_std::allocator<Color>_> *)&local_a8);
  Face::update_layer((vector<Color,_std::allocator<Color>_> *)&local_48,local_108,corner,layer,
                     (vector<Color,_std::allocator<Color>_> *)(local_e8 + 0x10));
  std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base(&local_48);
  std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
            ((_Vector_base<Color,_std::allocator<Color>_> *)(local_e8 + 0x10));
  if (layer == 3) {
    get_opposite_face((Pyraminx *)local_e8,(Corner)this);
    Face::turn_face((Face *)local_e8._0_8_,(uint)(dir == clockwise));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8));
  }
  std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base(&local_a8);
  std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base(&local_78);
  std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
  return;
}

Assistant:

void Pyraminx::turn_layer(Corner corner, int layer, Direction dir){
    // To keep the middle piece fixed in our view,
    // treat middle layer twists as counter-twists of all other layers
    if(layer == 2){
        if(dir == Direction::clockwise){
            dir = Direction::counterclockwise;
        }
        else{
            dir = Direction::clockwise;
        }
        turn_layer(corner, 0, dir);
        turn_layer(corner, 1, dir);
        turn_layer(corner, 3, dir);
    }
    else{
        // If we are turning from the back corner, treat 
        // the green face as the reference face. 
        // Otherwise use the blue face as the reference.
        std::shared_ptr<Face> ref_face;
        if(corner == Corner::B){
            ref_face = green_face;
        }
        else{
            ref_face = blue_face;
        }
        std::shared_ptr<Face> sending_face = ref_face->get_sending_neighbor(corner, dir);
        std::shared_ptr<Face> receiving_face = ref_face->get_receiving_neighbor(corner, dir);
        std::vector<Color> sender_color = sending_face->get_layer(corner, layer);
        std::vector<Color> old_color = ref_face->update_layer(corner, layer, sender_color);
        std::vector<Color> receiver_old_color = receiving_face->update_layer(corner, layer, old_color);
        sending_face->update_layer(corner, layer, receiver_old_color);

        // If we rotate a base layer, we are also rotating the face 
        // opposite the corner in the reverse direction
        if(layer == 3){
            if(dir == Direction::clockwise){
                dir = Direction::counterclockwise;
            }
            else{
                dir = Direction::clockwise;
            }
            get_opposite_face(corner)->turn_face(dir);
        }
    }
}